

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin2.c
# Opt level: O1

Gia_Man_t *
Gia_ManCreateUnate(Gia_Man_t *p,Abc_Cex_t *pCex,int iFrame,int nRealPis,int fUseAllObjects)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  int *piVar6;
  Gia_Obj_t *pGVar7;
  bool bVar8;
  uint *pInfo;
  Gia_Man_t *p_00;
  char *pcVar9;
  ulong uVar10;
  Vec_Int_t *pVVar11;
  Gia_Obj_t *pGVar12;
  Gia_Obj_t *pGVar13;
  Gia_Man_t *pGVar14;
  byte bVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  int iVar22;
  uint uVar23;
  
  if ((iFrame < 0) || (pCex->iFrame < iFrame)) {
    __assert_fail("iFrame >= 0 && iFrame <= pCex->iFrame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin2.c"
                  ,0xbc,"Gia_Man_t *Gia_ManCreateUnate(Gia_Man_t *, Abc_Cex_t *, int, int, int)");
  }
  p_00 = Gia_ManStart(1000);
  pcVar9 = (char *)malloc(6);
  builtin_strncpy(pcVar9,"unate",6);
  p_00->pName = pcVar9;
  Gia_ManCleanValue(p);
  uVar18 = p->nRegs;
  uVar10 = (ulong)uVar18;
  if (nRealPis < 0) {
    if (0 < (int)uVar18) {
      iVar17 = 0;
      do {
        iVar22 = p->vCis->nSize;
        uVar18 = (iVar22 - (int)uVar10) + iVar17;
        if (((int)uVar18 < 0) || (iVar22 <= (int)uVar18)) goto LAB_0057adda;
        uVar18 = p->vCis->pArray[uVar18];
        if (((long)(int)uVar18 < 0) || (p->nObjs <= (int)uVar18)) goto LAB_0057adbb;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar5 = p->pObjs + (int)uVar18;
        if (fUseAllObjects == 0) {
          if (p->nObjs <= (int)uVar18) goto LAB_0057ae18;
          uVar16 = p->nTtWords * iFrame;
          if (((int)uVar16 < 0) || (p->vTruths->nSize <= (int)uVar16)) goto LAB_0057adf9;
          if (((uint)p->vTruths->pArray[(ulong)uVar16 + (ulong)(uVar18 >> 4)] >>
               ((char)uVar18 * '\x02' & 0x1fU) & 2) != 0) {
            pGVar12 = Gia_ManAppendObj(p_00);
            uVar10 = *(ulong *)pGVar12;
            *(ulong *)pGVar12 = uVar10 | 0x9fffffff;
            *(ulong *)pGVar12 =
                 uVar10 & 0xe0000000ffffffff | 0x9fffffff |
                 (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
            pGVar13 = p_00->pObjs;
            if ((pGVar13 <= pGVar12) && (pGVar12 < pGVar13 + p_00->nObjs)) {
              Vec_IntPush(p_00->vCis,
                          (int)((ulong)((long)pGVar12 - (long)pGVar13) >> 2) * -0x55555555);
              pGVar13 = p_00->pObjs;
              if ((pGVar13 <= pGVar12) && (pGVar12 < pGVar13 + p_00->nObjs)) goto LAB_0057a551;
            }
            goto LAB_0057ae18;
          }
        }
        else {
          pGVar12 = Gia_ManAppendObj(p_00);
          uVar10 = *(ulong *)pGVar12;
          *(ulong *)pGVar12 = uVar10 | 0x9fffffff;
          *(ulong *)pGVar12 =
               uVar10 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar13 = p_00->pObjs;
          if ((pGVar12 < pGVar13) || (pGVar13 + p_00->nObjs <= pGVar12)) goto LAB_0057ae18;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar12 - (long)pGVar13) >> 2) * -0x55555555);
          pGVar13 = p_00->pObjs;
          if ((pGVar12 < pGVar13) ||
             (((pGVar13 + p_00->nObjs <= pGVar12 || (pGVar7 = p->pObjs, pGVar5 < pGVar7)) ||
              (pGVar7 + p->nObjs <= pGVar5)))) goto LAB_0057ae18;
          uVar18 = p->nTtWords * iFrame;
          if (((int)uVar18 < 0) || (p->vTruths->nSize <= (int)uVar18)) goto LAB_0057adf9;
          iVar22 = (int)((ulong)((long)pGVar5 - (long)pGVar7) >> 2) * -0x55555555;
          if (((uint)p->vTruths->pArray[(ulong)uVar18 + (long)(iVar22 >> 4)] >>
               ((char)iVar22 * '\x02' & 0x1fU) & 2) != 0) {
LAB_0057a551:
            pGVar5->Value = (int)((ulong)((long)pGVar12 - (long)pGVar13) >> 2) * 0x55555556;
          }
        }
        iVar17 = iVar17 + 1;
        uVar10 = (ulong)(uint)p->nRegs;
      } while (iVar17 < p->nRegs);
    }
  }
  else if (0 < (int)uVar18) {
    pVVar11 = p->vCis;
    iVar17 = pVVar11->nSize;
    uVar21 = (ulong)(iVar17 - uVar18);
    do {
      if (((int)uVar21 < 0) || (iVar17 <= (int)uVar21)) goto LAB_0057adda;
      uVar18 = pVVar11->pArray[uVar21];
      if (((long)(int)uVar18 < 0) || (p->nObjs <= (int)uVar18)) goto LAB_0057adbb;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar16 = p->nTtWords * iFrame;
      if (((int)uVar16 < 0) || (p->vTruths->nSize <= (int)uVar16)) goto LAB_0057adf9;
      p->pObjs[(int)uVar18].Value =
           ((uint)p->vTruths->pArray[(ulong)uVar16 + (ulong)(uVar18 >> 4)] >>
           ((char)uVar18 * '\x02' & 0x1fU)) >> 1 & 1;
      uVar21 = uVar21 + 1;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
  }
  Gia_ManHashAlloc(p_00);
  if (pCex->iFrame < iFrame) {
LAB_0057ab93:
    Gia_ManHashStop(p_00);
    uVar18 = pCex->iPo;
    iVar17 = p->vCos->nSize;
    if (iVar17 - p->nRegs <= (int)uVar18) {
      __assert_fail("v < Gia_ManPoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
    }
    if (((int)uVar18 < 0) || (iVar17 <= (int)uVar18)) {
LAB_0057adda:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    uVar18 = p->vCos->pArray[uVar18];
    if (((long)(int)uVar18 < 0) || (p->nObjs <= (int)uVar18)) {
LAB_0057adbb:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    uVar16 = pCex->iFrame * p->nTtWords;
    if (((int)uVar16 < 0) || (p->vTruths->nSize <= (int)uVar16)) {
LAB_0057adf9:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    if (((uint)p->vTruths->pArray[(ulong)uVar16 + (ulong)(uVar18 >> 4)] >>
         ((char)uVar18 * '\x02' & 0x1fU) & 2) == 0) {
      __assert_fail("(Gia_ManGetTwo(p, pCex->iFrame, pObj) >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin2.c"
                    ,0x128,"Gia_Man_t *Gia_ManCreateUnate(Gia_Man_t *, Abc_Cex_t *, int, int, int)")
      ;
    }
    uVar18 = p->pObjs[(int)uVar18].Value;
    if (uVar18 == 0) {
      __assert_fail("pObj->Value",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin2.c"
                    ,0x129,"Gia_Man_t *Gia_ManCreateUnate(Gia_Man_t *, Abc_Cex_t *, int, int, int)")
      ;
    }
    if (-1 < (int)uVar18) {
      uVar16 = uVar18 >> 1;
      if ((int)uVar16 < p_00->nObjs) {
        if ((~*(uint *)(p_00->pObjs + uVar16) & 0x1fffffff) != 0 &&
            (int)*(uint *)(p_00->pObjs + uVar16) < 0) {
          __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
        }
        pGVar13 = Gia_ManAppendObj(p_00);
        uVar10 = *(ulong *)pGVar13;
        *(ulong *)pGVar13 = uVar10 | 0x80000000;
        pGVar5 = p_00->pObjs;
        if ((pGVar5 <= pGVar13) && (pGVar13 < pGVar5 + p_00->nObjs)) {
          uVar21 = (ulong)(((uint)((int)pGVar13 - (int)pGVar5) >> 2) * -0x55555555 - uVar16 &
                          0x1fffffff);
          uVar19 = (ulong)((uVar18 & 1) << 0x1d);
          *(ulong *)pGVar13 = uVar19 | uVar10 & 0xffffffffc0000000 | 0x80000000 | uVar21;
          *(ulong *)pGVar13 =
               uVar19 | uVar10 & 0xe0000000c0000000 | 0x80000000 | uVar21 |
               (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
          pGVar5 = p_00->pObjs;
          if ((pGVar5 <= pGVar13) && (pGVar13 < pGVar5 + p_00->nObjs)) {
            Vec_IntPush(p_00->vCos,(int)((ulong)((long)pGVar13 - (long)pGVar5) >> 2) * -0x55555555);
            if (p_00->pFanData != (int *)0x0) {
              Gia_ObjAddFanout(p_00,pGVar13 + -(ulong)((uint)*(undefined8 *)pGVar13 & 0x1fffffff),
                               pGVar13);
            }
            if ((p_00->pObjs <= pGVar13) && (pGVar13 < p_00->pObjs + p_00->nObjs)) {
              pGVar14 = Gia_ManCleanup(p_00);
              Gia_ManStop(p_00);
              return pGVar14;
            }
          }
        }
        goto LAB_0057ae18;
      }
    }
    __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x314,"int Gia_ManAppendCo(Gia_Man_t *, int)");
  }
  while (uVar18 = p->nObjs, 0 < (int)uVar18) {
    uVar16 = p->nTtWords * iFrame;
    if (((int)uVar16 < 0) || (p->vTruths->nSize <= (int)uVar16)) goto LAB_0057adf9;
    pGVar5 = p->pObjs;
    piVar6 = p->vTruths->pArray;
    pGVar5->Value = (uint)piVar6[uVar16] >> 1 & 1;
    if (nRealPis < 0) {
      pVVar11 = p->vCis;
      uVar1 = pVVar11->nSize;
      uVar23 = uVar1 - p->nRegs;
      if (uVar23 != 0 && p->nRegs <= (int)uVar1) {
        if ((int)uVar1 < 1) {
          uVar1 = 0;
        }
        uVar10 = 0;
        do {
          if (uVar1 == uVar10) goto LAB_0057adda;
          uVar2 = pVVar11->pArray[uVar10];
          if (uVar18 <= uVar2) goto LAB_0057adbb;
          if (pGVar5 == (Gia_Obj_t *)0x0) break;
          if ((int)uVar18 <= (int)uVar2) goto LAB_0057ae18;
          pGVar5[uVar2].Value =
               ((uint)piVar6[(ulong)uVar16 + (long)((int)uVar2 >> 4)] >>
               ((char)uVar2 * '\x02' & 0x1fU)) >> 1 & 1;
          uVar10 = uVar10 + 1;
        } while (uVar23 != uVar10);
      }
    }
    else {
      pVVar11 = p->vCis;
      uVar10 = (ulong)(uint)pVVar11->nSize;
      if (p->nRegs < pVVar11->nSize) {
        lVar20 = 0;
        do {
          if ((int)uVar10 <= lVar20) goto LAB_0057adda;
          uVar18 = pVVar11->pArray[lVar20];
          if (((long)(int)uVar18 < 0) || (p->nObjs <= (int)uVar18)) goto LAB_0057adbb;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          uVar16 = p->nTtWords * iFrame;
          if (((int)uVar16 < 0) || (p->vTruths->nSize <= (int)uVar16)) goto LAB_0057adf9;
          pGVar5 = p->pObjs + (int)uVar18;
          piVar6 = p->vTruths->pArray;
          bVar15 = (char)uVar18 * '\x02' & 0x1e;
          pGVar5->Value = ((uint)piVar6[(ulong)uVar16 + (ulong)(uVar18 >> 4)] >> bVar15) >> 1 & 1;
          if (nRealPis <= lVar20) {
            if (fUseAllObjects == 0) {
              if (((uint)piVar6[(ulong)uVar16 + (ulong)(uVar18 >> 4)] >> bVar15 & 2) != 0) {
                pGVar12 = Gia_ManAppendObj(p_00);
                uVar10 = *(ulong *)pGVar12;
                *(ulong *)pGVar12 = uVar10 | 0x9fffffff;
                *(ulong *)pGVar12 =
                     uVar10 & 0xe0000000ffffffff | 0x9fffffff |
                     (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
                pGVar13 = p_00->pObjs;
                if ((pGVar13 <= pGVar12) && (pGVar12 < pGVar13 + p_00->nObjs)) {
                  Vec_IntPush(p_00->vCis,
                              (int)((ulong)((long)pGVar12 - (long)pGVar13) >> 2) * -0x55555555);
                  pGVar13 = p_00->pObjs;
                  if ((pGVar13 <= pGVar12) && (pGVar12 < pGVar13 + p_00->nObjs)) goto LAB_0057a866;
                }
                goto LAB_0057ae18;
              }
            }
            else {
              pGVar12 = Gia_ManAppendObj(p_00);
              uVar10 = *(ulong *)pGVar12;
              *(ulong *)pGVar12 = uVar10 | 0x9fffffff;
              *(ulong *)pGVar12 =
                   uVar10 & 0xe0000000ffffffff | 0x9fffffff |
                   (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
              pGVar13 = p_00->pObjs;
              if ((pGVar12 < pGVar13) || (pGVar13 + p_00->nObjs <= pGVar12)) goto LAB_0057ae18;
              Vec_IntPush(p_00->vCis,
                          (int)((ulong)((long)pGVar12 - (long)pGVar13) >> 2) * -0x55555555);
              pGVar13 = p_00->pObjs;
              if ((pGVar12 < pGVar13) ||
                 (((pGVar13 + p_00->nObjs <= pGVar12 || (pGVar7 = p->pObjs, pGVar5 < pGVar7)) ||
                  (pGVar7 + p->nObjs <= pGVar5)))) goto LAB_0057ae18;
              uVar18 = p->nTtWords * iFrame;
              if (((int)uVar18 < 0) || (p->vTruths->nSize <= (int)uVar18)) goto LAB_0057adf9;
              iVar17 = (int)((ulong)((long)pGVar5 - (long)pGVar7) >> 2) * -0x55555555;
              if (((uint)p->vTruths->pArray[(ulong)uVar18 + (long)(iVar17 >> 4)] >>
                   ((char)iVar17 * '\x02' & 0x1fU) & 2) != 0) {
LAB_0057a866:
                pGVar5->Value = (int)((ulong)((long)pGVar12 - (long)pGVar13) >> 2) * 0x55555556;
              }
            }
          }
          lVar20 = lVar20 + 1;
          pVVar11 = p->vCis;
          uVar10 = (ulong)pVVar11->nSize;
        } while (lVar20 < (long)(uVar10 - (long)p->nRegs));
      }
    }
    uVar18 = p->nObjs;
    uVar10 = (ulong)uVar18;
    if (0 < (int)uVar18) {
      bVar15 = 0;
      lVar20 = 8;
      uVar21 = 0;
      do {
        uVar18 = (uint)uVar10;
        pGVar5 = p->pObjs;
        if (pGVar5 == (Gia_Obj_t *)0x0) break;
        uVar10 = *(ulong *)((long)pGVar5 + lVar20 + -8);
        if ((uVar10 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar10) {
          *(undefined4 *)(&pGVar5->field_0x0 + lVar20) = 0;
          if ((long)(int)uVar18 <= (long)uVar21) goto LAB_0057ae18;
          uVar18 = p->nTtWords * iFrame;
          if (((int)uVar18 < 0) || (p->vTruths->nSize <= (int)uVar18)) goto LAB_0057adf9;
          uVar18 = (uint)p->vTruths->pArray[(ulong)uVar18 + (uVar21 >> 4 & 0xfffffff)] >>
                   (bVar15 & 0x1e);
          if ((uVar18 & 2) != 0) {
            iVar17 = *(int *)((long)pGVar5 +
                             lVar20 + (ulong)(uint)((int)(uVar10 & 0x1fffffff) << 2) * -3);
            if (iVar17 == 0) {
LAB_0057aa10:
              iVar17 = *(int *)((long)pGVar5 +
                               lVar20 + (ulong)((uint)(uVar10 >> 0x1e) & 0x7ffffffc) * -3);
              if (iVar17 == 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin2.c"
                              ,0x11c,
                              "Gia_Man_t *Gia_ManCreateUnate(Gia_Man_t *, Abc_Cex_t *, int, int, int)"
                             );
              }
            }
            else {
              iVar22 = *(int *)((long)pGVar5 +
                               lVar20 + (ulong)((uint)(uVar10 >> 0x1e) & 0x7ffffffc) * -3);
              if (iVar22 == 0) {
                if (iVar17 != 0) goto LAB_0057aa4f;
                goto LAB_0057aa10;
              }
              if ((uVar18 & 1) == 0) {
                if (iVar22 == 1 || iVar17 == 1) {
LAB_0057aa49:
                  if (iVar17 == 1) {
                    iVar17 = iVar22;
                  }
                }
                else {
                  iVar17 = Gia_ManHashOr(p_00,iVar17,iVar22);
                }
              }
              else {
                if (iVar22 == 1 || iVar17 == 1) goto LAB_0057aa49;
                iVar17 = Gia_ManHashAnd(p_00,iVar17,iVar22);
              }
            }
LAB_0057aa4f:
            *(int *)(&pGVar5->field_0x0 + lVar20) = iVar17;
          }
        }
        uVar21 = uVar21 + 1;
        uVar18 = p->nObjs;
        uVar10 = (ulong)(int)uVar18;
        bVar15 = bVar15 + 2;
        lVar20 = lVar20 + 0xc;
      } while ((long)uVar21 < (long)uVar10);
    }
    pVVar11 = p->vCos;
    iVar17 = pVVar11->nSize;
    if (0 < (long)iVar17) {
      piVar6 = pVVar11->pArray;
      lVar20 = 0;
      do {
        iVar22 = piVar6[lVar20];
        if (((long)iVar22 < 0) || ((int)uVar18 <= iVar22)) goto LAB_0057adbb;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar5 = p->pObjs + iVar22;
        pGVar5->Value = pGVar5[-(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff)].Value;
        lVar20 = lVar20 + 1;
      } while (iVar17 != lVar20);
    }
    if (iFrame == pCex->iFrame) goto LAB_0057ab93;
    iVar22 = p->nRegs;
    lVar20 = (long)iVar22;
    if (0 < lVar20) {
      uVar10 = (ulong)(uint)(iVar17 - iVar22);
      iVar22 = -iVar22;
      do {
        if ((iVar17 + iVar22 < 0) || (iVar17 <= iVar17 + iVar22)) goto LAB_0057adda;
        iVar3 = pVVar11->pArray[uVar10];
        if (((long)iVar3 < 0) || ((int)uVar18 <= iVar3)) goto LAB_0057adbb;
        pGVar5 = p->pObjs;
        if (pGVar5 == (Gia_Obj_t *)0x0) break;
        iVar4 = p->vCis->nSize;
        uVar16 = iVar22 + iVar4;
        if (((int)uVar16 < 0) || (iVar4 <= (int)uVar16)) goto LAB_0057adda;
        iVar4 = p->vCis->pArray[uVar16];
        if (((long)iVar4 < 0) || ((int)uVar18 <= iVar4)) goto LAB_0057adbb;
        pGVar5[iVar4].Value = pGVar5[iVar3].Value;
        iVar22 = iVar22 + 1;
        uVar10 = uVar10 + 1;
        lVar20 = lVar20 + -1;
      } while (lVar20 != 0);
    }
    bVar8 = pCex->iFrame <= iFrame;
    iFrame = iFrame + 1;
    if (bVar8) goto LAB_0057ab93;
  }
LAB_0057ae18:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

Gia_Man_t * Gia_ManCreateUnate( Gia_Man_t * p, Abc_Cex_t * pCex, int iFrame, int nRealPis, int fUseAllObjects )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjRo, * pObjRi;
    int f, k, Value;
    assert( iFrame >= 0 && iFrame <= pCex->iFrame );
    pNew = Gia_ManStart( 1000 );
    pNew->pName = Abc_UtilStrsav( "unate" );
    Gia_ManCleanValue( p );
    // set flop outputs
    if ( nRealPis < 0 ) // CEX min
    {
        Gia_ManForEachRo( p, pObj, k )
        {
            if ( fUseAllObjects )
            {
                int Value = Gia_ManAppendCi(pNew);
                if ( (Gia_ManGetTwo(p, iFrame, pObj) >> 1) ) // in the path
                    pObj->Value = Value;
            }
            else if ( (Gia_ManGetTwo(p, iFrame, pObj) >> 1) ) // in the path
                pObj->Value = Gia_ManAppendCi(pNew);
        }
    }
    else
    {
        Gia_ManForEachRo( p, pObj, k )
            pObj->Value = (Gia_ManGetTwo(p, iFrame, pObj) >> 1);
    }
    Gia_ManHashAlloc( pNew );
    for ( f = iFrame; f <= pCex->iFrame; f++ )
    {
/*
        printf( "  F%03d ", f );
        Gia_ManForEachRo( p, pObj, k )
            printf( "%d", pObj->Value > 0 );
        printf( "\n" );
*/
        // set const0 to const1 if present
        pObj = Gia_ManConst0(p);
        pObj->Value = (Gia_ManGetTwo(p, f, pObj) >> 1);
        // set primary inputs 
        if ( nRealPis < 0 ) // CEX min
        {
            Gia_ManForEachPi( p, pObj, k )
                pObj->Value = (Gia_ManGetTwo(p, f, pObj) >> 1);
        }
        else
        {
            Gia_ManForEachPi( p, pObj, k )
            {
                pObj->Value = (Gia_ManGetTwo(p, f, pObj) >> 1);
                if ( k >= nRealPis )
                {
                    if ( fUseAllObjects )
                    {
                        int Value = Gia_ManAppendCi(pNew);
                        if ( (Gia_ManGetTwo(p, f, pObj) >> 1) ) // in the path
                            pObj->Value = Value;
                    }
                    else if ( (Gia_ManGetTwo(p, f, pObj) >> 1) ) // in the path
                        pObj->Value = Gia_ManAppendCi(pNew);
                }
            }
        }
        // traverse internal nodes
        Gia_ManForEachAnd( p, pObj, k )
        { 
            pObj->Value = 0;
            Value = Gia_ManGetTwo(p, f, pObj);
            if ( !(Value >> 1) ) // not in the path
                continue;
            if ( Gia_ObjFanin0(pObj)->Value && Gia_ObjFanin1(pObj)->Value )
            {
                if ( 1 & Gia_ManGetTwo(p, f, pObj) ) // value 1
                {
                    if ( Gia_ObjFanin0(pObj)->Value > 1 && Gia_ObjFanin1(pObj)->Value > 1 )
                        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
                    else if ( Gia_ObjFanin0(pObj)->Value > 1 )
                        pObj->Value = Gia_ObjFanin0(pObj)->Value;
                    else if ( Gia_ObjFanin1(pObj)->Value > 1 )
                        pObj->Value = Gia_ObjFanin1(pObj)->Value;
                    else 
                        pObj->Value = 1;
                }
                else // value 0
                {
                    if ( Gia_ObjFanin0(pObj)->Value > 1 && Gia_ObjFanin1(pObj)->Value > 1 )
                        pObj->Value = Gia_ManHashOr( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
                    else if ( Gia_ObjFanin0(pObj)->Value > 1 )
                        pObj->Value = Gia_ObjFanin0(pObj)->Value;
                    else if ( Gia_ObjFanin1(pObj)->Value > 1 )
                        pObj->Value = Gia_ObjFanin1(pObj)->Value;
                    else 
                        pObj->Value = 1;
                }
            }
            else if ( Gia_ObjFanin0(pObj)->Value )
                pObj->Value = Gia_ObjFanin0(pObj)->Value;
            else if ( Gia_ObjFanin1(pObj)->Value )
                pObj->Value = Gia_ObjFanin1(pObj)->Value;
            else assert( 0 );
        }
        Gia_ManForEachCo( p, pObj, k )
            pObj->Value = Gia_ObjFanin0(pObj)->Value;
        if ( f == pCex->iFrame )
            break;
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            pObjRo->Value = pObjRi->Value;
    }
    Gia_ManHashStop( pNew );
    // create primary output
    pObj = Gia_ManPo(p, pCex->iPo);
    assert( (Gia_ManGetTwo(p, pCex->iFrame, pObj) >> 1) );
    assert( pObj->Value );
    Gia_ManAppendCo( pNew, pObj->Value );
    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}